

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglChooseConfigTests.cpp
# Opt level: O2

IterateResult __thiscall deqp::egl::ColorComponentTypeCase::iterate(ColorComponentTypeCase *this)

{
  bool bVar1;
  eglu *this_00;
  NotSupportedError *this_01;
  EGLDisplay in_RCX;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extensions;
  pair<unsigned_int,_int> local_20;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_18;
  
  tcu::TestContext::setTestResult
            ((this->super_ChooseConfigCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
             QP_TEST_RESULT_PASS,"Pass");
  this_00 = (eglu *)EglTestContext::getLibrary
                              ((this->super_ChooseConfigCase).super_TestCase.m_eglTestCtx);
  eglu::getDisplayExtensions_abi_cxx11_
            (&extensions,this_00,(Library *)(this->super_ChooseConfigCase).m_display,in_RCX);
  local_20 = (pair<unsigned_int,_int>)
             extensions.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  local_18._M_current =
       extensions.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  bVar1 = de::
          contains<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,char[27]>
                    ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&local_20,&local_18,(char (*) [27])"EGL_EXT_pixel_format_float");
  if (bVar1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&extensions);
    extensions.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    extensions.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    extensions.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_20.second = this->m_value;
    local_20.first = 0x3339;
    std::vector<std::pair<unsigned_int,int>,std::allocator<std::pair<unsigned_int,int>>>::
    emplace_back<std::pair<unsigned_int,int>>
              ((vector<std::pair<unsigned_int,int>,std::allocator<std::pair<unsigned_int,int>>> *)
               &extensions,&local_20);
    ChooseConfigCase::fillDontCare
              (&this->super_ChooseConfigCase,
               (vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
                *)&extensions);
    ChooseConfigCase::executeTest
              (&this->super_ChooseConfigCase,
               (vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
                *)&extensions,(this->super_ChooseConfigCase).m_checkOrder);
    std::_Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
    ::~_Vector_base((_Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
                     *)&extensions);
    return STOP;
  }
  this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_01,"EGL_EXT_pixel_format_float is not supported",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglChooseConfigTests.cpp"
             ,0x1ec);
  __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

TestCase::IterateResult iterate (void)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

		{
			const std::vector<std::string>	extensions	= eglu::getDisplayExtensions(m_eglTestCtx.getLibrary(), m_display);

			if (!de::contains(extensions.begin(), extensions.end(), "EGL_EXT_pixel_format_float"))
				TCU_THROW(NotSupportedError, "EGL_EXT_pixel_format_float is not supported");
		}

		{
			std::vector<std::pair<EGLenum, EGLint> > attributes;

			attributes.push_back(std::pair<EGLenum, EGLint>(EGL_COLOR_COMPONENT_TYPE_EXT, m_value));
			fillDontCare(attributes);

			executeTest(attributes, m_checkOrder);
		}

		return STOP;
	}